

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::StructuredAssignmentPatternExpression::forStruct
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  char *pcVar1;
  undefined4 uVar2;
  SyntaxKind kind;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  SyntaxNode *this;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters_00;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  Type *pTVar11;
  uint32_t extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  StructuredAssignmentPatternExpression *expr;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar12;
  Type *pTVar13;
  Expression *pEVar14;
  Diagnostic *pDVar15;
  Symbol *this_00;
  ulong uVar17;
  Symbol *extraout_RDX;
  Symbol *extraout_RDX_00;
  Symbol *extraout_RDX_01;
  Symbol *extraout_RDX_02;
  Symbol *extraout_RDX_03;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar18;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uint uVar19;
  Scope *args_1;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  FieldSymbol *field;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar29;
  SourceRange SVar30;
  string_view name;
  SourceRange SVar31;
  string_view name_00;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd38;
  Expression *defaultSetter;
  Token nameToken;
  Symbol *member;
  SymbolMap *local_278;
  Type *local_270;
  Symbol *local_268;
  ulong local_260;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  local_258;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_1e8;
  char local_1d8;
  char cStack_1d7;
  char cStack_1d6;
  byte bStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  byte bStack_1d1;
  char cStack_1d0;
  char cStack_1cf;
  char cStack_1ce;
  byte bStack_1cd;
  char cStack_1cc;
  char cStack_1cb;
  char cStack_1ca;
  byte bStack_1c9;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  byte bStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  byte bStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  byte bStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  byte bStack_1b9;
  pointer local_1b8;
  size_type sStack_1b0;
  SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  memberMap;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> typeSetters;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_4UL> memberSetters;
  specific_symbol_iterator<slang::ast::FieldSymbol> targetField;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar16;
  
  bVar22 = 0;
  defaultSetter = (Expression *)0x0;
  memberMap.super_Storage.ptr = (char *)&memberMap;
  memberMap._144_8_ = 0x3f;
  memberMap._152_8_ = 1;
  memberMap._160_8_ =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  memberMap._168_8_ = 0;
  memberMap._176_16_ = (undefined1  [16])0x0;
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.data_ =
       (pointer)memberSetters.
                super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                .firstElement;
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.len = 0;
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.cap = 4;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  data_ = (pointer)typeSetters.
                   super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                   .firstElement;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  len = 0;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  cap = 4;
  local_260 = (syntax->items).elements._M_extent._M_extent_value + 1;
  local_270 = type;
  local_268 = (Symbol *)structScope;
  memberMap.super_Storage._136_8_ = memberMap.super_Storage.ptr;
  if (1 < local_260) {
    local_260 = local_260 >> 1;
    bVar22 = 0;
    uVar9 = 0;
    do {
      ppSVar12 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((syntax->items).elements._M_ptr + uVar9 * 2));
      pSVar3 = *ppSVar12;
      this = *(SyntaxNode **)(pSVar3 + 1);
      kind = this->kind;
      if (kind == IdentifierName) {
        nameToken._0_8_ = *(undefined8 *)(this + 1);
        nameToken.info = (Info *)this[1].parent;
        name = parsing::Token::valueText(&nameToken);
        name_00._M_len = name._M_str;
        if ((Scope *)name._M_len == (Scope *)0x0) {
          bVar22 = 1;
        }
        else {
          member = Scope::find((Scope *)local_268,name);
          if (member == (Symbol *)0x0) {
            name_00._M_str = (char *)0x1;
            this_00 = Lookup::unqualified((Lookup *)(context->scope).ptr,(Scope *)name._M_len,
                                          name_00,(bitmask<slang::ast::LookupFlags>)
                                                  (underlying_type)structScope);
            if ((this_00 == (Symbol *)0x0) || (bVar7 = Symbol::isType(this_00), !bVar7)) {
              SVar30 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
              pDVar15 = ASTContext::addDiag(context,(DiagCode)0x3a000a,SVar30);
              Diagnostic::operator<<(pDVar15,name);
              bVar22 = 1;
              ast::operator<<(pDVar15,local_270);
            }
            else {
              pTVar13 = *(Type **)(pSVar3 + 2);
              SVar31 = parsing::Token::range(&nameToken);
              SVar30.endLoc = (SourceLocation)context;
              SVar30.startLoc = SVar31.endLoc;
              structScope = (Scope *)context;
              pEVar14 = Expression::bindRValue
                                  ((Expression *)this_00,pTVar13,(ExpressionSyntax *)SVar31.startLoc
                                   ,SVar30,(ASTContext *)0x0,in_stack_fffffffffffffd38);
              bVar7 = Expression::bad(pEVar14);
              elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
                   (pointer)this_00;
              elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
                   (size_type)pEVar14;
              SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
              emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                        (&typeSetters.
                          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                         ,(TypeSetter *)&elements);
              bVar22 = bVar22 | bVar7;
            }
          }
          else {
            pTVar11 = DeclaredType::getType((DeclaredType *)(member + 1));
            pTVar13 = *(Type **)(pSVar3 + 2);
            SVar30 = parsing::Token::range(&nameToken);
            SVar31.endLoc = (SourceLocation)context;
            SVar31.startLoc = SVar30.endLoc;
            pEVar14 = Expression::bindRValue
                                ((Expression *)pTVar11,pTVar13,(ExpressionSyntax *)SVar30.startLoc,
                                 SVar31,(ASTContext *)0x0,in_stack_fffffffffffffd38);
            bVar7 = Expression::bad(pEVar14);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = member;
            structScope = (Scope *)(SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                                   SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0));
            uVar20 = (ulong)structScope >> (memberMap._144_1_ & 0x3f);
            bVar22 = bVar22 | bVar7;
            local_258._M_ptr = (pointer)pEVar14;
            uVar2 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[(ulong)structScope & 0xff];
            uVar21 = 0;
            uVar17 = uVar20;
            do {
              pcVar1 = (char *)(memberMap._160_8_ + uVar17 * 0x10);
              local_1c8 = *pcVar1;
              cStack_1c7 = pcVar1[1];
              cStack_1c6 = pcVar1[2];
              bStack_1c5 = pcVar1[3];
              cStack_1c4 = pcVar1[4];
              cStack_1c3 = pcVar1[5];
              cStack_1c2 = pcVar1[6];
              bStack_1c1 = pcVar1[7];
              cStack_1c0 = pcVar1[8];
              cStack_1bf = pcVar1[9];
              cStack_1be = pcVar1[10];
              bStack_1bd = pcVar1[0xb];
              cStack_1bc = pcVar1[0xc];
              cStack_1bb = pcVar1[0xd];
              cStack_1ba = pcVar1[0xe];
              bStack_1b9 = pcVar1[0xf];
              cVar23 = (char)uVar2;
              auVar28[0] = -(local_1c8 == cVar23);
              cVar24 = (char)((uint)uVar2 >> 8);
              auVar28[1] = -(cStack_1c7 == cVar24);
              cVar25 = (char)((uint)uVar2 >> 0x10);
              auVar28[2] = -(cStack_1c6 == cVar25);
              bVar26 = (byte)((uint)uVar2 >> 0x18);
              auVar28[3] = -(bStack_1c5 == bVar26);
              auVar28[4] = -(cStack_1c4 == cVar23);
              auVar28[5] = -(cStack_1c3 == cVar24);
              auVar28[6] = -(cStack_1c2 == cVar25);
              auVar28[7] = -(bStack_1c1 == bVar26);
              auVar28[8] = -(cStack_1c0 == cVar23);
              auVar28[9] = -(cStack_1bf == cVar24);
              auVar28[10] = -(cStack_1be == cVar25);
              auVar28[0xb] = -(bStack_1bd == bVar26);
              auVar28[0xc] = -(cStack_1bc == cVar23);
              auVar28[0xd] = -(cStack_1bb == cVar24);
              auVar28[0xe] = -(cStack_1ba == cVar25);
              auVar28[0xf] = -(bStack_1b9 == bVar26);
              uVar19 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
              if (uVar19 != 0) {
                local_278 = (SymbolMap *)(memberMap._168_8_ + uVar17 * 0xf0);
                do {
                  iVar8 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                    }
                  }
                  if (member == *(Symbol **)
                                 ((long)&(local_278->table_).
                                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                         .arrays.groups_size_index + (ulong)(uint)(iVar8 << 4))) {
                    SVar30 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
                    pDVar15 = ASTContext::addDiag(context,(DiagCode)0x100007,SVar30);
                    Diagnostic::operator<<(pDVar15,name);
                    bVar22 = 1;
                    Diagnostic::addNote(pDVar15,(DiagCode)0xa0001,
                                        *(SourceRange *)
                                         (*(long *)((long)&(local_278->table_).
                                                                                                                      
                                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                                  .arrays.groups_size_mask +
                                                  (ulong)(uint)(iVar8 << 4)) + 0x20));
                    goto LAB_00727b9f;
                  }
                  uVar19 = uVar19 - 1 & uVar19;
                } while (uVar19 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)structScope & 7] & bStack_1b9)
                  == 0) break;
              lVar10 = uVar17 + uVar21;
              uVar21 = uVar21 + 1;
              uVar17 = lVar10 + 1U & memberMap._152_8_;
            } while (uVar21 <= (ulong)memberMap._152_8_);
            if ((ulong)memberMap._184_8_ < (ulong)memberMap._176_8_) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Expression_const*>
                        ((locator *)&elements,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                          *)&memberMap.super_Storage.field_0x88,(arrays_type *)&memberMap.field_0x90
                         ,uVar20,(size_t)structScope,(try_emplace_args_t *)&local_1e8,&member,
                         (Expression **)&local_258);
              memberMap._184_8_ = memberMap._184_8_ + 1;
              args_1 = structScope;
            }
            else {
              args_1 = (Scope *)&member;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Expression_const*>
                        ((locator *)&elements,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                          *)&memberMap.super_Storage.field_0x88,(size_t)structScope,
                         (try_emplace_args_t *)&local_1e8,(Symbol **)args_1,
                         (Expression **)&local_258);
            }
            elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)member;
            elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = (size_type)pEVar14;
            SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::
            emplace_back<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                      (&memberSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                       ,(MemberSetter *)&elements);
            structScope = args_1;
          }
        }
      }
      else if (kind == DefaultPatternKeyExpression) {
        if (defaultSetter != (Expression *)0x0) {
          SVar30 = slang::syntax::SyntaxNode::sourceRange(this);
          bVar22 = 1;
          ASTContext::addDiag(context,(DiagCode)0xf0007,SVar30);
        }
        defaultSetter =
             Expression::selfDetermined
                       (comp,*(ExpressionSyntax **)(pSVar3 + 2),context,
                        (bitmask<slang::ast::ASTFlags>)0x0);
        bVar7 = Expression::bad(defaultSetter);
LAB_00727773:
        bVar22 = bVar22 | bVar7;
      }
      else {
        bVar7 = slang::syntax::DataTypeSyntax::isKind(kind);
        if (bVar7) {
          pTVar13 = Compilation::getType
                              (comp,(DataTypeSyntax *)*(SyntaxNode **)(pSVar3 + 1),context,
                               (Type *)0x0);
          bVar7 = Type::isSimpleType(pTVar13);
          if (bVar7) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = context;
            structScope = (Scope *)context;
            pEVar14 = Expression::bindRValue
                                ((Expression *)pTVar13,*(Type **)(pSVar3 + 2),
                                 (ExpressionSyntax *)0x0,(SourceRange)(auVar6 << 0x40),
                                 (ASTContext *)0x0,in_stack_fffffffffffffd38);
            elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)pTVar13;
            elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = (size_type)pEVar14;
            SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
            emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                      (&typeSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                       ,(TypeSetter *)&elements);
            bVar7 = Expression::bad(pEVar14);
            goto LAB_00727773;
          }
          SVar30 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
          bVar22 = 1;
          ASTContext::addDiag(context,(DiagCode)0x120007,SVar30);
        }
        else {
          SVar30 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
          bVar22 = 1;
          ASTContext::addDiag(context,(DiagCode)0x120007,SVar30);
        }
      }
LAB_00727b9f:
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_260);
  }
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  sVar29 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)local_268);
  sVar16 = sVar29._M_end.current;
  targetField = sVar29._M_begin.current;
  do {
    bVar7 = targetField.current == sVar16.current;
    targetField = sVar29._M_begin.current;
    if (bVar7) {
      nameToken._0_4_ =
           SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::copy
                     (&memberSetters.
                       super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                      ,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)sVar29._M_end.current.current);
      nameToken.rawLen = extraout_var;
      iVar8 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
                        (&typeSetters.
                          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                         ,(EVP_PKEY_CTX *)comp,src);
      member = (Symbol *)CONCAT44(extraout_var_00,iVar8);
      local_258._M_ptr = (pointer)0x0;
      local_258._M_extent._M_extent_value = 0;
      iVar8 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,
                         (EVP_PKEY_CTX *)comp,src_00);
      local_1e8._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar8);
      expr = BumpAllocator::
             emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter_const,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                       (&comp->super_BumpAllocator,local_270,
                        (span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                         *)&nameToken,
                        (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                         *)&member,&local_258,&defaultSetter,&local_1e8,&sourceRange);
      if (bVar22 != 0) {
        expr = (StructuredAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)expr)
        ;
      }
      if (elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ !=
          (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement) {
        operator_delete(elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_);
      }
      if (typeSetters.
          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.data_
          != (pointer)typeSetters.
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                      .firstElement) {
        operator_delete(typeSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                        .data_);
      }
      if (memberSetters.
          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.
          data_ != (pointer)memberSetters.
                            super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                            .firstElement) {
        operator_delete(memberSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                        .data_);
      }
      boost::unordered::detail::foa::
      table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
      ::delete_((allocator_type)memberMap.super_Storage._136_8_,
                (table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                 *)&memberMap.field_0x90);
      return (Expression *)expr;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = targetField.current;
    uVar17 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar9 = uVar17 >> (memberMap._144_1_ & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar17 & 0xff];
    uVar20 = 0;
    do {
      pcVar1 = (char *)(memberMap._160_8_ + uVar9 * 0x10);
      local_1d8 = *pcVar1;
      cStack_1d7 = pcVar1[1];
      cStack_1d6 = pcVar1[2];
      bStack_1d5 = pcVar1[3];
      cStack_1d4 = pcVar1[4];
      cStack_1d3 = pcVar1[5];
      cStack_1d2 = pcVar1[6];
      bStack_1d1 = pcVar1[7];
      cStack_1d0 = pcVar1[8];
      cStack_1cf = pcVar1[9];
      cStack_1ce = pcVar1[10];
      bStack_1cd = pcVar1[0xb];
      cStack_1cc = pcVar1[0xc];
      cStack_1cb = pcVar1[0xd];
      cStack_1ca = pcVar1[0xe];
      bStack_1c9 = pcVar1[0xf];
      cVar23 = (char)uVar2;
      auVar27[0] = -(local_1d8 == cVar23);
      cVar24 = (char)((uint)uVar2 >> 8);
      auVar27[1] = -(cStack_1d7 == cVar24);
      cVar25 = (char)((uint)uVar2 >> 0x10);
      auVar27[2] = -(cStack_1d6 == cVar25);
      bVar26 = (byte)((uint)uVar2 >> 0x18);
      auVar27[3] = -(bStack_1d5 == bVar26);
      auVar27[4] = -(cStack_1d4 == cVar23);
      auVar27[5] = -(cStack_1d3 == cVar24);
      auVar27[6] = -(cStack_1d2 == cVar25);
      auVar27[7] = -(bStack_1d1 == bVar26);
      auVar27[8] = -(cStack_1d0 == cVar23);
      auVar27[9] = -(cStack_1cf == cVar24);
      auVar27[10] = -(cStack_1ce == cVar25);
      auVar27[0xb] = -(bStack_1cd == bVar26);
      auVar27[0xc] = -(cStack_1cc == cVar23);
      auVar27[0xd] = -(cStack_1cb == cVar24);
      auVar27[0xe] = -(cStack_1ca == cVar25);
      auVar27[0xf] = -(bStack_1c9 == bVar26);
      uVar19 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
      if (uVar19 != 0) {
        lVar10 = memberMap._168_8_ + uVar9 * 0xf0;
        do {
          iVar8 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
            }
          }
          if ((FieldSymbol *)targetField.current ==
              *(FieldSymbol **)(lVar10 + (ulong)(uint)(iVar8 << 4))) {
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,
                       (Expression **)(lVar10 + (ulong)(uint)(iVar8 << 4) + 8));
            sVar18.current = extraout_RDX_03;
            bVar26 = bVar22;
            goto LAB_007275a0;
          }
          uVar19 = uVar19 - 1 & uVar19;
        } while (uVar19 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7] & bStack_1c9) == 0) break;
      lVar10 = uVar9 + uVar20;
      uVar20 = uVar20 + 1;
      uVar9 = lVar10 + 1U & memberMap._152_8_;
    } while (uVar20 <= (ulong)memberMap._152_8_);
    pTVar11 = DeclaredType::getType((DeclaredType *)(targetField.current + 1));
    pTVar13 = pTVar11->canonical;
    sVar18.current = extraout_RDX;
    if (pTVar13 == (Type *)0x0) {
      Type::resolveCanonical(pTVar11);
      pTVar13 = pTVar11->canonical;
      sVar18.current = extraout_RDX_00;
    }
    bVar26 = 1;
    if (((pTVar13->super_Symbol).kind != ErrorType) && (((targetField.current)->name)._M_len != 0))
    {
      local_1b8 = typeSetters.
                  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                  .data_;
      sStack_1b0 = typeSetters.
                   super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                   .len;
      typeSetters_00._M_extent._M_extent_value =
           typeSetters.
           super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.len;
      typeSetters_00._M_ptr =
           typeSetters.
           super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
           data_;
      nameToken._0_8_ =
           matchElementValue(context,pTVar11,(FieldSymbol *)targetField.current,sourceRange,
                             typeSetters_00,defaultSetter);
      if ((Expression *)nameToken._0_8_ == (Expression *)0x0) {
        bVar26 = 1;
        sVar18.current = extraout_RDX_01;
      }
      else {
        SmallVectorBase<slang::ast::Expression_const*>::
        emplace_back<slang::ast::Expression_const*const&>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,
                   (Expression **)&nameToken);
        sVar18.current = extraout_RDX_02;
        bVar26 = bVar22;
      }
    }
LAB_007275a0:
    do {
      targetField.current =
           (((FieldSymbol *)targetField.current)->super_VariableSymbol).super_ValueSymbol.
           super_Symbol.nextInScope;
      if ((FieldSymbol *)targetField.current == (FieldSymbol *)0x0) {
        targetField.current = (Symbol *)0x0;
        break;
      }
    } while ((((FieldSymbol *)targetField.current)->super_VariableSymbol).super_ValueSymbol.
             super_Symbol.kind != Field);
    sVar29._M_end.current = sVar18.current;
    sVar29._M_begin.current = targetField.current;
    bVar22 = bVar26;
  } while( true );
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forStruct(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    bool bad = false;
    const Expression* defaultSetter = nullptr;
    SmallMap<const Symbol*, const Expression*, 8> memberMap;
    SmallVector<MemberSetter, 4> memberSetters;
    SmallVector<TypeSetter, 4> typeSetters;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            if (defaultSetter) {
                context.addDiag(diag::AssignmentPatternKeyDupDefault, item->key->sourceRange());
                bad = true;
            }
            defaultSetter = &selfDetermined(comp, *item->expr, context);
            bad |= defaultSetter->bad();
        }
        else if (item->key->kind == SyntaxKind::IdentifierName) {
            auto nameToken = item->key->as<IdentifierNameSyntax>().identifier;
            auto name = nameToken.valueText();
            if (name.empty()) {
                bad = true;
                continue;
            }

            const Symbol* member = structScope.find(name);
            if (member) {
                auto& expr = bindRValue(member->as<FieldSymbol>().getType(), *item->expr,
                                        nameToken.range(), context);
                bad |= expr.bad();

                auto [it, inserted] = memberMap.emplace(member, &expr);
                if (!inserted) {
                    auto& diag = context.addDiag(diag::AssignmentPatternKeyDupName,
                                                 item->key->sourceRange());
                    diag << name;
                    diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
                    bad = true;
                    continue;
                }

                memberSetters.emplace_back(MemberSetter{member, &expr});
            }
            else {
                auto found = Lookup::unqualified(*context.scope, name, LookupFlags::Type);
                if (found && found->isType()) {
                    auto& expr = bindRValue(found->as<Type>(), *item->expr, nameToken.range(),
                                            context);
                    bad |= expr.bad();

                    typeSetters.emplace_back(TypeSetter{&found->as<Type>(), &expr});
                }
                else {
                    auto& diag = context.addDiag(diag::UnknownMember, item->key->sourceRange());
                    diag << name;
                    diag << type;
                    bad = true;
                }
            }
        }
        else if (DataTypeSyntax::isKind(item->key->kind)) {
            const Type& typeKey = comp.getType(item->key->as<DataTypeSyntax>(), context);
            if (typeKey.isSimpleType()) {
                auto& expr = bindRValue(typeKey, *item->expr, {}, context);
                typeSetters.emplace_back(TypeSetter{&typeKey, &expr});
                bad |= expr.bad();
            }
            else {
                context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
                bad = true;
            }
        }
        else {
            context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
            bad = true;
        }
    }

    SmallVector<const Expression*> elements;
    for (auto& field : structScope.membersOfType<FieldSymbol>()) {
        // If we already have a setter for this field we don't have to do anything else.
        if (auto it = memberMap.find(&field); it != memberMap.end()) {
            elements.push_back(it->second);
            continue;
        }

        const Type& fieldType = field.getType();
        if (fieldType.isError() || field.name.empty()) {
            bad = true;
            continue;
        }

        auto expr = matchElementValue(context, fieldType, &field, sourceRange, typeSetters,
                                      defaultSetter);
        if (!expr) {
            bad = true;
            continue;
        }

        elements.push_back(expr);
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, memberSetters.copy(comp), typeSetters.copy(comp), std::span<const IndexSetter>{},
        defaultSetter, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}